

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O1

set<Token,_std::less<Token>,_std::allocator<Token>_> * __thiscall
ResponseBase::extractTokensFromLine
          (set<Token,_std::less<Token>,_std::allocator<Token>_> *__return_storage_ptr__,
          ResponseBase *this,string *line)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  set<Token,_std::less<Token>,_std::allocator<Token>_> header_tokens;
  set<Token,_std::less<Token>,_std::allocator<Token>_> std_tokens;
  _Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_> local_90;
  _Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_> local_60;
  
  for (uVar2 = std::__cxx11::string::find((char *)line,0x176e83,0); uVar2 != 0xffffffffffffffff;
      uVar2 = std::__cxx11::string::find((char *)line,0x176e83,uVar2 + 1)) {
    std::__cxx11::string::replace((ulong)line,uVar2,(char *)0x2,0x176f08);
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  extractStdTokensFromLine
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)&local_60,this,line);
  std::_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>>::
  _M_insert_range_unique<std::move_iterator<std::_Rb_tree_const_iterator<Token>>>
            ((_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>> *)
             __return_storage_ptr__,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)
             local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)
             &local_60._M_impl.super__Rb_tree_header);
  extractHeaderTokensFromLine
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)&local_90,this,line);
  std::_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>>::
  _M_insert_range_unique<std::move_iterator<std::_Rb_tree_const_iterator<Token>>>
            ((_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>> *)
             __return_storage_ptr__,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)
             local_90._M_impl.super__Rb_tree_header._M_header._M_left,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)
             &local_90._M_impl.super__Rb_tree_header);
  std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
  ~_Rb_tree(&local_90);
  std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
  ~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::set<Token> extractTokensFromLine(std::string line) const { // TODO needs some love
        str::replace_all(line, "\\_", "_");

        std::set<Token> tokens;

        std::set<Token> std_tokens = extractStdTokensFromLine(line);
        tokens.insert(std::make_move_iterator(std_tokens.begin()), std::make_move_iterator(std_tokens.end()));

        std::set<Token> header_tokens = extractHeaderTokensFromLine(line);
        tokens.insert(std::make_move_iterator(header_tokens.begin()), std::make_move_iterator(header_tokens.end()));

        return tokens;
    }